

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::SocketStream::flush(SocketStream *this)

{
  uchar *puVar1;
  void *__buf;
  size_t in_RCX;
  int in_R8D;
  SocketStream *this_local;
  
  if (-1 < (this->super_DisconnectableStream).super_SelectableStream.fd) {
    puVar1 = ExpandableBuffer::get
                       ((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020);
    __buf = (void *)ExpandableBuffer::size
                              ((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020)
    ;
    send(this,(int)puVar1,__buf,in_RCX,in_R8D);
    ExpandableBuffer::clear((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020);
    return;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                ,0x1f6,"virtual void Dashel::SocketStream::flush()");
}

Assistant:

virtual void flush()
		{
			assert(fd >= 0);

#ifdef TCP_CORK
			int flag = 0;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
			flag = 1;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
#else
			send(sendBuffer.get(), sendBuffer.size());
			sendBuffer.clear();
#endif
		}